

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

void __thiscall
CBlockPolicyEstimator::CBlockPolicyEstimator
          (CBlockPolicyEstimator *this,path *estimation_filepath,bool read_stale_estimates)

{
  path *this_00;
  _Rb_tree_header *p_Var1;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *this_03;
  iterator iVar2;
  TxConfirmStats *pTVar3;
  _Head_base<0UL,_TxConfirmStats_*,_false> __ptr_00;
  pointer pcVar4;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  bool bVar5;
  mapped_type_conflict *pmVar6;
  TxConfirmStats *pTVar7;
  _Head_base<0UL,_TxConfirmStats_*,_false> this_04;
  FILE *file;
  long lVar8;
  long lVar9;
  undefined4 uVar10;
  undefined7 in_register_00000011;
  mapped_type_conflict mVar11;
  pointer *__ptr;
  pointer __p;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  char cVar12;
  undefined4 in_stack_ffffffffffffff2c;
  default_delete<TxConfirmStats> *pdVar13;
  default_delete<TxConfirmStats> *pdVar14;
  default_delete<TxConfirmStats> *this_05;
  long local_b8;
  long local_b0;
  void *local_a8;
  undefined8 uStack_a0;
  long local_98;
  AutoFile est_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  uVar10 = (undefined4)CONCAT71(in_register_00000011,read_stale_estimates);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_CValidationInterface)._vptr_CValidationInterface =
       (_func_int **)&PTR_UpdatedBlockTip_013b6758;
  this_00 = &this->m_estimation_filepath;
  std::filesystem::__cxx11::path::path(&this_00->super_path,&estimation_filepath->super_path);
  p_Var1 = &(this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header;
  mVar11 = 0;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex + 8) = 0
  ;
  *(undefined8 *)((long)&(this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex + 0x10)
       = 0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_cs_fee_estimator).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->nBestSeenHeight = 0;
  this->firstRecordedHeight = 0;
  this->historicalFirst = 0;
  this->historicalBest = 0;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pdVar13 = (default_delete<TxConfirmStats> *)&this->feeStats;
  this_01 = &this->shortStats;
  this_05 = (default_delete<TxConfirmStats> *)&this->longStats;
  this_02 = &this->buckets;
  this_03 = &this->bucketMap;
  p_Var1 = &(this->bucketMap)._M_t._M_impl.super__Rb_tree_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->feeStats)._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
  _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  (this->shortStats)._M_t.
  super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
  super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  (this->longStats)._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>
  ._M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)0x0;
  this->trackedTxs = 0;
  this->untrackedTxs = 0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  est_file.m_file = (FILE *)0x408f400000000000;
  do {
    iVar2._M_current =
         (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)this_02,iVar2,(double *)&est_file);
    }
    else {
      *iVar2._M_current = (double)est_file.m_file;
      (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    pmVar6 = std::
             map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
             ::operator[](this_03,(key_type_conflict5 *)&est_file);
    *pmVar6 = mVar11;
    est_file.m_file = (FILE *)((double)est_file.m_file * 1.05);
    mVar11 = mVar11 + 1;
  } while ((double)est_file.m_file <= 10000000.0);
  iVar2._M_current =
       (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_02,iVar2,&INF_FEERATE);
  }
  else {
    *iVar2._M_current = 1e+99;
    (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pmVar6 = std::
           map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
           ::operator[](this_03,&INF_FEERATE);
  *pmVar6 = mVar11;
  if ((this->bucketMap)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (long)(this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    __assert_fail("bucketMap.size() == buckets.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                  ,0x227,
                  "CBlockPolicyEstimator::CBlockPolicyEstimator(const fs::path &, const bool)");
  }
  pdVar14 = pdVar13;
  pTVar7 = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(pTVar7,this_02,this_03,0x18,0.9952,2);
  est_file.m_file = (FILE *)0x0;
  pTVar3 = *(TxConfirmStats **)pdVar13;
  *(TxConfirmStats **)pdVar13 = pTVar7;
  if (pTVar3 != (TxConfirmStats *)0x0) {
    std::default_delete<TxConfirmStats>::operator()(pdVar13,pTVar3);
  }
  if (est_file.m_file != (FILE *)0x0) {
    std::default_delete<TxConfirmStats>::operator()
              ((default_delete<TxConfirmStats> *)&est_file,(TxConfirmStats *)est_file.m_file);
  }
  this_04._M_head_impl = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(this_04._M_head_impl,this_02,this_03,0xc,0.962,1);
  est_file.m_file = (FILE *)0x0;
  __ptr_00._M_head_impl =
       (this_01->_M_t).super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
       _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
       super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
  (this_01->_M_t).super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
  super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
  super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = this_04._M_head_impl;
  if (__ptr_00._M_head_impl != (TxConfirmStats *)0x0) {
    std::default_delete<TxConfirmStats>::operator()
              ((default_delete<TxConfirmStats> *)this_01,__ptr_00._M_head_impl);
  }
  if (est_file.m_file != (FILE *)0x0) {
    std::default_delete<TxConfirmStats>::operator()
              ((default_delete<TxConfirmStats> *)&est_file,(TxConfirmStats *)est_file.m_file);
  }
  pdVar13 = this_05;
  pTVar7 = (TxConfirmStats *)operator_new(0xb0);
  TxConfirmStats::TxConfirmStats(pTVar7,this_02,this_03,0x2a,0.99931,0x18);
  est_file.m_file = (FILE *)0x0;
  pTVar3 = *(TxConfirmStats **)this_05;
  *(TxConfirmStats **)this_05 = pTVar7;
  if (pTVar3 != (TxConfirmStats *)0x0) {
    std::default_delete<TxConfirmStats>::operator()(this_05,pTVar3);
  }
  if (est_file.m_file != (FILE *)0x0) {
    std::default_delete<TxConfirmStats>::operator()
              ((default_delete<TxConfirmStats> *)&est_file,(TxConfirmStats *)est_file.m_file);
  }
  file = fsbridge::fopen((char *)this_00,"rb");
  local_a8 = (void *)0x0;
  uStack_a0 = 0;
  local_98 = 0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start._4_4_ = in_stack_ffffffffffffff2c;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start._0_4_ = uVar10;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)pdVar14;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pdVar13;
  AutoFile::AutoFile(&est_file,(FILE *)file,data_xor);
  cVar12 = (char)uVar10;
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8,local_98 - (long)local_a8);
  }
  if (est_file.m_file == (FILE *)0x0) {
    pcVar4 = (this->m_estimation_filepath).super_path._M_pathname._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,pcVar4,
               pcVar4 + (this->m_estimation_filepath).super_path._M_pathname._M_string_length);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
    ;
    source_file_00._M_len = 0x5f;
    logging_function_00._M_str = "CBlockPolicyEstimator";
    logging_function_00._M_len = 0x15;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_00,source_file_00,0x230,ALL,Info,(ConstevalFormatString<1U>)0xfb9c62
               ,&local_58);
LAB_0098927c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_00989299;
  }
  else {
    lVar8 = std::filesystem::last_write_time(&this_00->super_path);
    lVar9 = std::chrono::_V2::system_clock::now();
    if ((lVar9 - lVar8) + 0x26a8d2b340ae0000U < 0x8000c7b99bfe2000 || cVar12 != '\0') {
      bVar5 = Read(this,&est_file);
      if (bVar5) goto LAB_00989299;
      pcVar4 = (this->m_estimation_filepath).super_path._M_pathname._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,pcVar4,
                 pcVar4 + (this->m_estimation_filepath).super_path._M_pathname._M_string_length);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x5f;
      logging_function._M_str = "CBlockPolicyEstimator";
      logging_function._M_len = 0x15;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x23b,ALL,Info,(ConstevalFormatString<1U>)0xfb9cf4,
                 &local_58);
      goto LAB_0098927c;
    }
    pcVar4 = (this->m_estimation_filepath).super_path._M_pathname._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,pcVar4,
               pcVar4 + (this->m_estimation_filepath).super_path._M_pathname._M_string_length);
    local_b0 = ((lVar9 - lVar8) + -0x59572d4cbf520000) / 3600000000000;
    local_b8 = 0x3c;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
    ;
    source_file_01._M_len = 0x5f;
    logging_function_01._M_str = "CBlockPolicyEstimator";
    logging_function_01._M_len = 0x15;
    LogPrintFormatInternal<std::__cxx11::string,long,long>
              (logging_function_01,source_file_01,0x236,ALL,Info,(ConstevalFormatString<3U>)0xfb9c85
               ,&local_58,&local_b0,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_00989299;
  }
  operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
LAB_00989299:
  AutoFile::~AutoFile(&est_file);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

CBlockPolicyEstimator::CBlockPolicyEstimator(const fs::path& estimation_filepath, const bool read_stale_estimates)
    : m_estimation_filepath{estimation_filepath}
{
    static_assert(MIN_BUCKET_FEERATE > 0, "Min feerate must be nonzero");
    size_t bucketIndex = 0;

    for (double bucketBoundary = MIN_BUCKET_FEERATE; bucketBoundary <= MAX_BUCKET_FEERATE; bucketBoundary *= FEE_SPACING, bucketIndex++) {
        buckets.push_back(bucketBoundary);
        bucketMap[bucketBoundary] = bucketIndex;
    }
    buckets.push_back(INF_FEERATE);
    bucketMap[INF_FEERATE] = bucketIndex;
    assert(bucketMap.size() == buckets.size());

    feeStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, MED_BLOCK_PERIODS, MED_DECAY, MED_SCALE));
    shortStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, SHORT_BLOCK_PERIODS, SHORT_DECAY, SHORT_SCALE));
    longStats = std::unique_ptr<TxConfirmStats>(new TxConfirmStats(buckets, bucketMap, LONG_BLOCK_PERIODS, LONG_DECAY, LONG_SCALE));

    AutoFile est_file{fsbridge::fopen(m_estimation_filepath, "rb")};

    if (est_file.IsNull()) {
        LogPrintf("%s is not found. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
        return;
    }

    std::chrono::hours file_age = GetFeeEstimatorFileAge();
    if (file_age > MAX_FILE_AGE && !read_stale_estimates) {
        LogPrintf("Fee estimation file %s too old (age=%lld > %lld hours) and will not be used to avoid serving stale estimates.\n", fs::PathToString(m_estimation_filepath), Ticks<std::chrono::hours>(file_age), Ticks<std::chrono::hours>(MAX_FILE_AGE));
        return;
    }

    if (!Read(est_file)) {
        LogPrintf("Failed to read fee estimates from %s. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
    }
}